

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<int,_unsigned_char,_THashTraits<int>,_TValueTraits<unsigned_char>_>::NewKey
          (TMap<int,_unsigned_char,_THashTraits<int>,_TValueTraits<unsigned_char>_> *this,int key)

{
  Node *pNVar1;
  IPair IVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint uVar5;
  hash_t hVar6;
  Node *pNVar7;
  Node *pNVar8;
  uint uVar9;
  
  pNVar4 = this->Nodes;
  hVar6 = this->Size;
  do {
    uVar9 = hVar6 - 1 & key;
    pNVar1 = pNVar4 + uVar9;
    pNVar3 = pNVar4[uVar9].Next;
    if (pNVar3 == (Node *)0x1) {
LAB_002c7f4b:
      pNVar8 = (Node *)0x0;
      pNVar4 = pNVar1;
LAB_002c7f50:
      pNVar1->Next = pNVar8;
      this->NumUsed = this->NumUsed + 1;
      (pNVar4->Pair).Key = key;
      return pNVar4;
    }
    pNVar8 = this->LastFree;
    while (pNVar7 = pNVar8, pNVar8 = pNVar7 + -1, pNVar4 < pNVar7) {
      if (pNVar8->Next == (Node *)0x1) {
        this->LastFree = pNVar8;
        uVar5 = hVar6 - 1 & (pNVar1->Pair).Key;
        if (uVar5 != uVar9) {
          pNVar4 = pNVar4 + uVar5;
          do {
            pNVar3 = pNVar4;
            pNVar4 = pNVar3->Next;
          } while (pNVar4 != pNVar1);
          pNVar3->Next = pNVar8;
          IVar2 = pNVar1->Pair;
          pNVar8->Next = pNVar1->Next;
          pNVar7[-1].Pair = IVar2;
          goto LAB_002c7f4b;
        }
        pNVar8->Next = pNVar3;
        pNVar4 = pNVar8;
        goto LAB_002c7f50;
      }
    }
    this->LastFree = pNVar8;
    Resize(this,hVar6 * 2);
    pNVar4 = this->Nodes;
    hVar6 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}